

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::LockFile(PosixEnv *this,string *filename,FileLock **lock)

{
  pthread_mutex_t *__mutex;
  int __fd;
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  Slice local_98;
  Slice local_88;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = 0;
  __fd = open((char *)*lock,0x80042,0x1a4);
  if (__fd < 0) {
    __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      PosixError((string *)this,(int)*lock);
      return (Status)(char *)this;
    }
    goto LAB_00d2c313;
  }
  __mutex = (pthread_mutex_t *)(filename + 6);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar4 = std::__throw_system_error(iVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar4);
      }
    }
    goto LAB_00d2c313;
  }
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&filename[7]._M_string_length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
  pthread_mutex_unlock(__mutex);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    close(__fd);
    std::operator+(&local_58,"lock ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
    local_88.data_ = local_58._M_dataplus._M_p;
    local_88.size_ = local_58._M_string_length;
    local_98.data_ = "already held by process";
    local_98.size_ = 0x17;
    Status::Status((Status *)this,kIOError,&local_88,&local_98);
LAB_00d2c250:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    local_58.field_2._8_8_ = 0;
    local_58._M_dataplus._M_p = (pointer)0x1;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    iVar1 = fcntl(__fd,6);
    if (iVar1 == -1) {
      close(__fd);
      PosixLockTable::Remove((PosixLockTable *)&__mutex->__data,(string *)lock);
      std::operator+(&local_58,"lock ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
      PosixError((string *)this,(int)local_58._M_dataplus._M_p);
      goto LAB_00d2c250;
    }
    puVar3 = (undefined8 *)operator_new(0x30);
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,*lock,
               (long)&(*lock)->_vptr_FileLock + (long)&lock[1]->_vptr_FileLock);
    *puVar3 = &PTR__PosixFileLock_013bd050;
    *(int *)(puVar3 + 1) = __fd;
    puVar3[2] = puVar3 + 4;
    if (local_78 == &local_68) {
      puVar3[4] = local_68;
      puVar3[5] = uStack_60;
    }
    else {
      puVar3[2] = local_78;
      puVar3[4] = local_68;
    }
    puVar3[3] = local_70;
    *in_RCX = puVar3;
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
LAB_00d2c313:
  __stack_chk_fail();
}

Assistant:

Status LockFile(const std::string& filename, FileLock** lock) override {
    *lock = nullptr;

    int fd = ::open(filename.c_str(), O_RDWR | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!locks_.Insert(filename)) {
      ::close(fd);
      return Status::IOError("lock " + filename, "already held by process");
    }

    if (LockOrUnlock(fd, true) == -1) {
      int lock_errno = errno;
      ::close(fd);
      locks_.Remove(filename);
      return PosixError("lock " + filename, lock_errno);
    }

    *lock = new PosixFileLock(fd, filename);
    return Status::OK();
  }